

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

Parsekey __thiscall
free_format_parser::HMpsFF::parseCols(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  uint uVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  HighsLogOptions *log_options_;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  Parsekey PVar5;
  size_t sVar6;
  iterator iVar7;
  long lVar8;
  HighsInt id;
  _Alloc_hider end_00;
  ulong uVar9;
  int iVar10;
  char *__rhs;
  HMpsFF *pHVar11;
  ulong uVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  pVar13;
  bool skip;
  HighsLogOptions *local_210;
  double local_208;
  double local_200;
  string name;
  string marker;
  ulong local_1b8;
  _Alloc_hider local_1b0;
  ulong local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  double local_188;
  HighsInt rowidx;
  string strline;
  size_t end;
  string word;
  vector<int,_std::allocator<int>_> col_index;
  vector<double,_std::allocator<double>_> col_value;
  string colname;
  anon_class_16_2_6d4174b4 parseName;
  size_t start;
  string local_70;
  string local_50;
  
  local_210 = log_options;
  std::__cxx11::string::string((string *)&colname,"",(allocator *)&strline);
  strline._M_dataplus._M_p = (pointer)&strline.field_2;
  strline._M_string_length = 0;
  strline.field_2._M_local_buf[0] = '\0';
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  col_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  col_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  col_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  marker._M_dataplus._M_p = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&col_value,(long)this->num_row,(value_type_conflict1 *)&marker);
  pHVar11 = (HMpsFF *)&col_index;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)pHVar11,(long)this->num_row);
  parseName.rowidx = &rowidx;
  this_00 = &this->rowname2idx;
  local_200 = 0.0;
  local_1a0._8_8_ = 0;
  local_1b0._M_p = (pointer)0x1;
  local_1a0._M_allocated_capacity = 0;
  local_1b8 = 1;
  local_1a8 = 1;
  local_188 = 0.0;
  uVar9 = 0;
  bVar4 = false;
  parseName.this = this;
LAB_002233ce:
  do {
    bVar2 = getMpsLine(pHVar11,file,&strline,&skip);
    if (!bVar2) {
LAB_00223df2:
      PVar5 = kFail;
LAB_00223df6:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&col_index.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&col_value.super__Vector_base<double,_std::allocator<double>_>);
      std::__cxx11::string::~string((string *)&word);
      std::__cxx11::string::~string((string *)&strline);
      std::__cxx11::string::~string((string *)&colname);
      return PVar5;
    }
  } while (skip != false);
  bVar2 = timeout(this);
  log_options_ = local_210;
  if (bVar2) {
    PVar5 = kTimeout;
    goto LAB_00223df6;
  }
  end_00._M_p = (pointer)&end;
  PVar5 = checkFirstWord(this,&strline,&start,(size_t *)end_00._M_p,&word);
  sVar6 = end;
  if (PVar5 != kNone) {
    if (this->num_col != 0) {
      if ((local_200 != 0.0) || (NAN(local_200))) {
        marker._M_dataplus._M_p._0_4_ = this->num_col + -1;
        marker._M_string_length = (size_type)local_200;
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<std::pair<int,double>>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   &this->coeffobj,(pair<int,_double> *)&marker);
      }
      uVar12 = 0;
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        iVar10 = col_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
        marker._M_dataplus._M_p =
             (pointer)col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar10];
        marker._M_string_length = CONCAT44(this->num_col + -1,iVar10);
        std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
        emplace_back<std::tuple<int,int,double>>
                  ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>> *)
                   &this->entries,(tuple<int,_int,_double> *)&marker);
        col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar10] = 0.0;
      }
    }
    this->warning_issued_ =
         (local_188 != 0.0 || local_1a0._M_allocated_capacity != 0) || local_1a0._8_8_ != 0;
    if ((local_188 != 0.0 || local_1a0._M_allocated_capacity != 0) || local_1a0._8_8_ != 0) {
      highsLogUser(log_options_,kWarning,
                   "COLUMNS section: ignored %d undefined rows %d duplicate cost values and %d duplicate matrix values\n"
                  );
    }
    highsLogDev(log_options_,kInfo,"readMPS: Read COLUMNS OK\n");
    goto LAB_00223df6;
  }
  first_word(&marker,&strline,end);
  sVar6 = first_word_end(&strline,sVar6);
  bVar2 = std::operator==(&marker,"\'MARKER\'");
  if (bVar2) {
    first_word(&name,&strline,sVar6);
    std::__cxx11::string::operator=((string *)&marker,(string *)&name);
    std::__cxx11::string::~string((string *)&name);
    if (bVar4) {
      __rhs = "\'INTEND\'";
    }
    else {
      __rhs = "\'INTORG\'";
    }
    bVar2 = std::operator!=(&marker,__rhs);
    if (bVar2) {
      highsLogUser(local_210,kError,"Integrality marker error in COLUMNS section of MPS file\n");
      goto LAB_00223e67;
    }
    bVar4 = (bool)(bVar4 ^ 1);
    goto LAB_00223c61;
  }
  if ((sVar6 < 9) &&
     (iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this_00->_M_h,&marker),
     iVar7.
     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
     ._M_cur == (__node_type *)0x0)) {
    std::__cxx11::string::substr((ulong)&name,(ulong)&strline);
    trim(&name,&default_non_chars_abi_cxx11_);
    std::__cxx11::string::_M_assign((string *)&name);
    if (name._M_string_length < 9) {
      this->warning_issued_ = true;
      highsLogUser(local_210,kWarning,
                   "Row name \"%s\" with spaces has length %d, so assume fixed format\n",
                   name._M_dataplus._M_p);
      PVar5 = kFixedFormat;
    }
    else {
      highsLogUser(local_210,kError,
                   "Row name \"%s\" with spaces exceeds fixed format name length of 8\n",
                   name._M_dataplus._M_p);
      PVar5 = kFail;
    }
    std::__cxx11::string::~string((string *)&name);
  }
  else {
    _Var3 = std::operator==(&word,&colname);
    if (!_Var3) {
      if (this->num_col != 0) {
        if ((local_200 != 0.0) || (NAN(local_200))) {
          name._M_dataplus._M_p._0_4_ = this->num_col + -1;
          name._M_string_length = (size_type)local_200;
          std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
          emplace_back<std::pair<int,double>>
                    ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                     &this->coeffobj,(pair<int,_double> *)&name);
          local_200 = 0.0;
        }
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
          iVar10 = col_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
          name._M_dataplus._M_p =
               (pointer)col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar10];
          name._M_string_length = CONCAT44(this->num_col + -1,iVar10);
          std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
          emplace_back<std::tuple<int,int,double>>
                    ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                      *)&this->entries,(tuple<int,_int,_double> *)&name);
          col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar10] = 0.0;
        }
        uVar9 = 0;
      }
      std::__cxx11::string::_M_assign((string *)&colname);
      iVar10 = this->num_col;
      uVar1 = iVar10 + 1;
      end_00._M_p = (pointer)(ulong)uVar1;
      this->num_col = uVar1;
      name._M_dataplus._M_p._0_4_ = iVar10;
      pVar13 = std::
               _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::_M_emplace<std::__cxx11::string&,int>
                         ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)&this->colname2idx,&colname,&name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->col_names,&colname);
      if ((((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (this->has_duplicate_col_name_ == false)) {
        this->has_duplicate_col_name_ = true;
        iVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->colname2idx)._M_h,&colname);
        std::__cxx11::string::_M_assign((string *)&this->duplicate_col_name_);
        this->duplicate_col_name_index0_ =
             *(HighsInt *)
              ((long)iVar7.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                     ._M_cur + 0x28);
        this->duplicate_col_name_index1_ = this->num_col + -1;
      }
      name._M_dataplus._M_p = (pointer)CONCAT71(name._M_dataplus._M_p._1_7_,bVar4);
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::emplace_back<HighsVarType>
                (&this->col_integrality,(HighsVarType *)&name);
      std::vector<bool,_std::allocator<bool>_>::push_back
                (&this->col_binary,(bool)(this->kintegerVarsInColumnsAreBinary & bVar4));
      name._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&this->col_lower,(double *)&name);
      std::vector<double,_std::allocator<double>_>::push_back
                (&this->col_upper,(value_type_conflict1 *)&kHighsInf);
    }
    std::__cxx11::string::assign((char *)&word);
    first_word(&name,&strline,sVar6);
    std::__cxx11::string::operator=((string *)&word,(string *)&name);
    std::__cxx11::string::~string((string *)&name);
    sVar6 = first_word_end(&strline,sVar6);
    end = sVar6;
    bVar2 = std::operator==(&word,"");
    if (!bVar2) {
      pHVar11 = (HMpsFF *)this_00;
      iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this_00->_M_h,&marker);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_188 = (double)((long)local_188 + 1);
        if ((ulong)local_188 % local_1a8 == 0) {
          end_00 = marker._M_dataplus;
          highsLogUser(local_210,kWarning,
                       "Row name \"%s\" in COLUMNS section is not defined: ignored\n");
          local_1a8 = local_1a8 * 2;
        }
      }
      else {
        name._M_dataplus._M_p = name._M_dataplus._M_p & 0xffffffffffffff00;
        local_208 = getValue(pHVar11,&word,(bool *)&name,(HighsInt)end_00._M_p);
        if ((char)name._M_dataplus._M_p == '\x01') {
          highsLogUser(local_210,kError,"Coefficient for column \"%s\" is NaN\n",
                       marker._M_dataplus._M_p);
          goto LAB_00223e67;
        }
        if ((local_208 != 0.0) || (NAN(local_208))) {
          std::__cxx11::string::string((string *)&local_50,(string *)&marker);
          parseCols::anon_class_16_2_6d4174b4::operator()(&parseName,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          lVar8 = (long)rowidx;
          if (lVar8 < 0) {
            if (rowidx == -1) {
              if ((local_200 != 0.0) || (NAN(local_200))) {
                local_1a0._M_allocated_capacity = local_1a0._M_allocated_capacity + 1;
                if (local_1a0._M_allocated_capacity % local_1b8 == 0) {
                  end_00 = colname._M_dataplus;
                  highsLogUser(local_210,kWarning,
                               "Column \"%s\" has duplicate nonzero %g in objective row \"%s\": ignored\n"
                               ,local_208,colname._M_dataplus._M_p,marker._M_dataplus._M_p);
                  local_1b8 = local_1b8 * 2;
                }
              }
              else {
                local_200 = local_208;
              }
            }
          }
          else if ((col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8] != 0.0) ||
                  (NAN(col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8]))) {
            this->num_nz = this->num_nz + -1;
            local_1a0._8_8_ = local_1a0._8_8_ + 1;
            end_00._M_p = (pointer)col_value.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)local_1a0._8_8_ % (ulong)local_1b0._M_p == 0) {
              end_00 = colname._M_dataplus;
              highsLogUser(local_210,kWarning,
                           "Column \"%s\" has duplicate nonzero %g in row \"%s\": ignored\n",
                           local_208,colname._M_dataplus._M_p,marker._M_dataplus._M_p);
              local_1b0._M_p = local_1b0._M_p * 2;
            }
          }
          else {
            col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8] = local_208;
            end_00._M_p = (pointer)(long)(int)uVar9;
            uVar9 = (ulong)((int)uVar9 + 1);
            col_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)end_00._M_p] = rowidx;
          }
        }
      }
      id = (HighsInt)end_00._M_p;
      bVar2 = is_end(&strline,sVar6,&default_non_chars_abi_cxx11_);
      if (!bVar2) {
        first_word(&name,&strline,sVar6);
        std::__cxx11::string::operator=((string *)&marker,(string *)&name);
        std::__cxx11::string::~string((string *)&name);
        bVar2 = std::operator==(&word,"");
        if (bVar2) {
          trim(&marker,&default_non_chars_abi_cxx11_);
          highsLogUser(local_210,kError,"No coefficient given for column \"%s\"\n",
                       marker._M_dataplus._M_p);
          goto LAB_00223e67;
        }
        sVar6 = first_word_end(&strline,sVar6);
        std::__cxx11::string::assign((char *)&word);
        first_word(&name,&strline,sVar6 + 1);
        std::__cxx11::string::operator=((string *)&word,(string *)&name);
        std::__cxx11::string::~string((string *)&name);
        end = first_word_end(&strline,sVar6 + 1);
        pHVar11 = (HMpsFF *)this_00;
        iVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_00->_M_h,&marker);
        if (iVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur != (__node_type *)0x0) {
          name._M_dataplus._M_p = name._M_dataplus._M_p & 0xffffffffffffff00;
          local_208 = getValue(pHVar11,&word,(bool *)&name,id);
          if ((char)name._M_dataplus._M_p == '\x01') {
            highsLogUser(local_210,kError,"Coefficient for column \"%s\" is NaN\n",
                         marker._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&marker);
            goto LAB_00223df2;
          }
          if ((local_208 != 0.0) || (NAN(local_208))) {
            std::__cxx11::string::string((string *)&local_70,(string *)&marker);
            parseCols::anon_class_16_2_6d4174b4::operator()(&parseName,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            lVar8 = (long)rowidx;
            if (lVar8 < 0) {
              if (rowidx == -1) {
                if ((local_200 != 0.0) || (NAN(local_200))) {
                  local_1a0._M_allocated_capacity = local_1a0._M_allocated_capacity + 1;
                  if (local_1a0._M_allocated_capacity % local_1b8 == 0) {
                    highsLogUser(local_210,kWarning,
                                 "Column \"%s\" has duplicate nonzero %g in objective row \"%s\": ignored\n"
                                 ,local_208,colname._M_dataplus._M_p,
                                 (this->objective_name)._M_dataplus._M_p);
                    local_1b8 = local_1b8 * 2;
                  }
                }
                else {
                  local_200 = local_208;
                }
              }
            }
            else if ((col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8] != 0.0) ||
                    (NAN(col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar8]))) {
              this->num_nz = this->num_nz + -1;
              local_1a0._8_8_ = local_1a0._8_8_ + 1;
              if ((ulong)local_1a0._8_8_ % (ulong)local_1b0._M_p == 0) {
                highsLogUser(local_210,kWarning,
                             "Column \"%s\" has duplicate nonzero %g in row \"%s\": ignored\n",
                             local_208,colname._M_dataplus._M_p,marker._M_dataplus._M_p);
                local_1b0._M_p = local_1b0._M_p * 2;
              }
            }
            else {
              col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] = local_208;
              iVar10 = (int)uVar9;
              uVar9 = (ulong)(iVar10 + 1);
              col_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar10] = rowidx;
            }
          }
          pHVar11 = (HMpsFF *)&marker;
          std::__cxx11::string::~string((string *)pHVar11);
          goto LAB_002233ce;
        }
        local_188 = (double)((long)local_188 + 1);
        if ((ulong)local_188 % local_1a8 == 0) {
          highsLogUser(local_210,kWarning,
                       "Row name \"%s\" in COLUMNS section is not defined: ignored\n",
                       marker._M_dataplus._M_p);
          local_1a8 = local_1a8 * 2;
        }
      }
LAB_00223c61:
      pHVar11 = (HMpsFF *)&marker;
      std::__cxx11::string::~string((string *)pHVar11);
      goto LAB_002233ce;
    }
    trim(&marker,&default_non_chars_abi_cxx11_);
    highsLogUser(local_210,kError,"No coefficient given for column \"%s\"\n",marker._M_dataplus._M_p
                );
LAB_00223e67:
    PVar5 = kFail;
  }
  std::__cxx11::string::~string((string *)&marker);
  goto LAB_00223df6;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseCols(const HighsLogOptions& log_options,
                                            std::istream& file) {
  std::string colname = "";
  std::string strline, word;
  HighsInt rowidx;
  size_t start, end;
  bool integral_cols = false;
  assert(num_col == 0);
  // Define the scattered value vector, index vector and count
  std::vector<double> col_value;
  std::vector<HighsInt> col_index;
  HighsInt col_count = 0;
  double col_cost = 0;
  col_value.assign(num_row, 0);
  col_index.resize(num_row);

  auto parseName = [&rowidx, this](std::string name) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    if (rowidx >= 0)
      this->num_nz++;
    else
      assert(-1 == rowidx || -2 == rowidx);
  };

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_cost_nz = 0;
  size_t report_ignored_duplicate_cost_nz_frequency = 1;
  size_t num_ignored_duplicate_matrix_nz = 0;
  size_t report_ignored_duplicate_matrix_nz_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    HMpsFF::Parsekey key = checkFirstWord(strline, start, end, word);

    // start of new section?
    if (key != Parsekey::kNone) {
      if (num_col) {
        if (col_cost) {
          coeffobj.push_back(std::make_pair(num_col - 1, col_cost));
          col_cost = 0;
        }
        for (HighsInt iEl = 0; iEl < col_count; iEl++) {
          const HighsInt iRow = col_index[iEl];
          assert(col_value[iRow]);
          entries.push_back(
              std::make_tuple(num_col - 1, iRow, col_value[iRow]));
          col_value[iRow] = 0;
        }
        col_count = 0;
      }

      warning_issued_ = num_ignored_row_name > 0 ||
                        num_ignored_duplicate_cost_nz > 0 ||
                        num_ignored_duplicate_matrix_nz > 0;
      if (warning_issued_)
        highsLogUser(log_options, HighsLogType::kWarning,
                     "COLUMNS section: ignored %d undefined rows %d duplicate "
                     "cost values and %d duplicate matrix values\n",
                     int(num_ignored_row_name),
                     int(num_ignored_duplicate_cost_nz),
                     int(num_ignored_duplicate_matrix_nz));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read COLUMNS OK\n");
      return key;
    }

    // check for integrality marker
    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    if (marker == "'MARKER'") {
      marker = first_word(strline, end_marker);

      if ((integral_cols && marker != "'INTEND'") ||
          (!integral_cols && marker != "'INTORG'")) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Integrality marker error in COLUMNS section of MPS file\n");
        return Parsekey::kFail;
      }
      integral_cols = !integral_cols;

      continue;
    }
    // Detect whether the file is in fixed format with spaces in
    // names, even if there are no known examples!
    //
    // end_marker should be the end index of the row name:
    //
    // If the names are at least 8 characters, end_marker should be
    // more than 13 minus the 4 whitespaces we have trimmed from the
    // start so more than 9
    //
    // However, free format MPS can have names with only one character
    // (pyomo.mps). Have to distinguish this from 8-character names
    // with spaces. Best bet is to see whether "marker" is in the set
    // of row names. If it is, then assume that the names are short
    if (end_marker < 9) {
      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        // marker is not a row name, so continue to look at name
        std::string name = strline.substr(0, 10);
        // Delete trailing spaces
        name = trim(name);
        if (name.size() > 8) {
          highsLogUser(log_options, HighsLogType::kError,
                       "Row name \"%s\" with spaces exceeds fixed format name "
                       "length of 8\n",
                       name.c_str());
          return HMpsFF::Parsekey::kFail;
        } else {
          warning_issued_ = true;
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" with spaces has length %d, so assume "
                       "fixed format\n",
                       name.c_str(), (int)name.size());
          return HMpsFF::Parsekey::kFixedFormat;
        }
      }
    }

    // Test for new column
    if (!(word == colname)) {
      // Record the nonzeros in any previous column
      if (num_col) {
        if (col_cost) {
          coeffobj.push_back(std::make_pair(num_col - 1, col_cost));
          col_cost = 0;
        }
        for (HighsInt iEl = 0; iEl < col_count; iEl++) {
          const HighsInt iRow = col_index[iEl];
          assert(col_value[iRow]);
          entries.push_back(
              std::make_tuple(num_col - 1, iRow, col_value[iRow]));
          col_value[iRow] = 0;
        }
        col_count = 0;
      }
      assert(!col_cost);
      colname = word;
      auto ret = colname2idx.emplace(colname, num_col++);
      col_names.push_back(colname);
      if (!ret.second) {
        // Duplicate col name
        if (!has_duplicate_col_name_) {
          // This is the first so record it
          has_duplicate_col_name_ = true;
          auto mit = colname2idx.find(colname);
          assert(mit != colname2idx.end());
          duplicate_col_name_ = colname;
          duplicate_col_name_index0_ = mit->second;
          duplicate_col_name_index1_ = num_col - 1;
        }
      }

      // Mark the column as integer, according to whether
      // the integral_cols flag is set
      col_integrality.push_back(integral_cols ? HighsVarType::kInteger
                                              : HighsVarType::kContinuous);
      // Mark the column as binary as well
      col_binary.push_back(integral_cols && kintegerVarsInColumnsAreBinary);

      // initialize with default bounds
      col_lower.push_back(0.0);
      col_upper.push_back(kHighsInf);
    }

    assert(num_col > 0);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No coefficient given for column \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);
    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "Row name \"%s\" in COLUMNS section is not defined: ignored\n",
            marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(log_options, HighsLogType::kError,
                     "Coefficient for column \"%s\" is NaN\n", marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (value) {
        parseName(marker);  // rowidx set and num_nz incremented
        if (rowidx >= 0) {
          if (col_value[rowidx]) {
            // Ignore duplicate entry
            num_nz--;
            num_ignored_duplicate_matrix_nz++;
            if (num_ignored_duplicate_matrix_nz %
                    report_ignored_duplicate_matrix_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in row "
                           "\"%s\": ignored\n",
                           colname.c_str(), value, marker.c_str());
              report_ignored_duplicate_matrix_nz_frequency *= 2;
            }
          } else {
            col_value[rowidx] = value;
            col_index[col_count++] = rowidx;
          }
        } else if (rowidx == -1) {
          // Ignore duplicate entry
          if (col_cost) {
            num_ignored_duplicate_cost_nz++;
            if (num_ignored_duplicate_cost_nz %
                    report_ignored_duplicate_cost_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in "
                           "objective row \"%s\": ignored\n",
                           colname.c_str(), value, marker.c_str());
              report_ignored_duplicate_cost_nz_frequency *= 2;
            }
          } else {
            col_cost = value;
          }
        }
      }
    }

    if (!is_end(strline, end)) {
      // parse second coefficient
      marker = first_word(strline, end);
      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No coefficient given for column \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      end_marker++;
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      assert(is_end(strline, end));

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in COLUMNS section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
        continue;
      };
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(log_options, HighsLogType::kError,
                     "Coefficient for column \"%s\" is NaN\n", marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (value) {
        parseName(marker);  // rowidx set and num_nz incremented
        if (rowidx >= 0) {
          if (col_value[rowidx]) {
            // Ignore duplicate entry
            num_nz--;
            num_ignored_duplicate_matrix_nz++;
            if (num_ignored_duplicate_matrix_nz %
                    report_ignored_duplicate_matrix_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in row "
                           "\"%s\": ignored\n",
                           colname.c_str(), value, marker.c_str());
              report_ignored_duplicate_matrix_nz_frequency *= 2;
            }
          } else {
            col_value[rowidx] = value;
            col_index[col_count++] = rowidx;
          }
        } else if (rowidx == -1) {
          // Ignore duplicate entry
          if (col_cost) {
            num_ignored_duplicate_cost_nz++;
            if (num_ignored_duplicate_cost_nz %
                    report_ignored_duplicate_cost_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in "
                           "objective row \"%s\": ignored\n",
                           colname.c_str(), value, objective_name.c_str());
              report_ignored_duplicate_cost_nz_frequency *= 2;
            }
          } else {
            col_cost = value;
          }
        }
      }
    }
  }

  return Parsekey::kFail;
}